

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall helics::CommonCore::sendDisconnect(CommonCore *this,action_t disconnectType)

{
  FederateState *this_00;
  BaseTimeCoordinator *pBVar1;
  int iVar2;
  string_view message;
  FederateStates FVar3;
  uint uVar4;
  long lVar5;
  FedInfo **ppFVar6;
  FedInfo **ppFVar7;
  uint uVar8;
  ulong uVar9;
  FedInfo *pFVar10;
  FedInfo **ppFVar11;
  string_view name;
  ActionMessage bye;
  ActionMessage disconnect;
  ActionMessage local_1a0;
  ActionMessage local_e8;
  
  if (8 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
    message._M_str = "sending disconnect";
    message._M_len = 0x12;
    name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    name._M_len = (this->super_BrokerBase).identifier._M_string_length;
    BrokerBase::sendToLogger
              (&this->super_BrokerBase,
               (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,9,name,message,
               false);
  }
  checkInFlightQueriesForDisconnect(this);
  ActionMessage::ActionMessage(&local_1a0,disconnectType);
  local_1a0.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
  if ((this->loopFederates).dataStorage.csize == 0) {
    uVar9 = (ulong)(this->loopFederates).dataStorage.bsize;
    ppFVar11 = (this->loopFederates).dataStorage.dataptr;
    if (uVar9 != 0x20) {
      ppFVar11 = ppFVar11 + (this->loopFederates).dataStorage.dataSlotIndex;
      pFVar10 = *ppFVar11 + uVar9;
      goto LAB_002f5081;
    }
    if (ppFVar11 == (FedInfo **)0x0) {
      ppFVar11 = &gmlc::containers::
                  StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end::
                  emptyValue;
    }
    else {
      ppFVar11 = ppFVar11 + (long)(this->loopFederates).dataStorage.dataSlotIndex + 1;
    }
  }
  else {
    ppFVar11 = (this->loopFederates).dataStorage.dataptr;
  }
  pFVar10 = *ppFVar11;
  uVar9 = 0;
LAB_002f5081:
  uVar4 = (this->loopFederates).dataStorage.bsize;
  ppFVar6 = (this->loopFederates).dataStorage.dataptr;
  lVar5 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
  if (ppFVar6 == (FedInfo **)0x0) {
    ppFVar7 = &gmlc::containers::
               StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end::
               emptyValue;
  }
  else {
    ppFVar7 = ppFVar6 + lVar5 + 1;
  }
  uVar8 = 0;
  if (uVar4 != 0x20) {
    uVar8 = uVar4;
  }
  ppFVar6 = ppFVar6 + lVar5;
  if (uVar4 == 0x20) {
    ppFVar6 = ppFVar7;
  }
  if ((uint)uVar9 == uVar8) goto LAB_002f5113;
  do {
    do {
      this_00 = pFVar10->fed;
      FVar3 = FederateState::getState(this_00);
      if (FVar3 != FINISHED) {
        local_1a0.dest_id.gid = (this_00->global_id)._M_i.gid;
        FederateState::addAction(this_00,&local_1a0);
      }
      if ((this->super_BrokerBase).hasTimeDependency == true) {
        pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        (*pBVar1->_vptr_BaseTimeCoordinator[6])(pBVar1,(ulong)(uint)(this_00->global_id)._M_i.gid);
        pBVar1 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        (*pBVar1->_vptr_BaseTimeCoordinator[7])(pBVar1,(ulong)(uint)(this_00->global_id)._M_i.gid);
      }
      iVar2 = (int)uVar9;
      uVar4 = iVar2 + 1;
      if (iVar2 < 0x1f) {
        pFVar10 = pFVar10 + 1;
      }
      else {
        ppFVar11 = ppFVar11 + (ulong)(iVar2 - 0x1fU >> 5) + 1;
        uVar4 = uVar4 & 0x1f;
        pFVar10 = (FedInfo *)((long)&(*ppFVar11)->fed + (ulong)(uVar4 << 4));
      }
      uVar9 = (ulong)uVar4;
    } while (uVar4 != uVar8);
LAB_002f5113:
  } while (ppFVar11 != ppFVar6);
  if ((this->super_BrokerBase).hasTimeDependency != false) {
    BaseTimeCoordinator::disconnect
              ((this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
  }
  if (this->filterFed != (FilterFederate *)0x0) {
    FilterFederate::handleMessage(this->filterFed,&local_1a0);
  }
  ActionMessage::ActionMessage(&local_e8,cmd_disconnect);
  local_e8.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
  (*(this->super_Core)._vptr_Core[0x6b])(this,0);
  ActionMessage::~ActionMessage(&local_e8);
  ActionMessage::~ActionMessage(&local_1a0);
  return;
}

Assistant:

void CommonCore::sendDisconnect(action_message_def::action_t disconnectType)
{
    LOG_CONNECTIONS(global_broker_id_local, identifier, "sending disconnect");
    checkInFlightQueriesForDisconnect();
    ActionMessage bye(disconnectType);
    bye.source_id = global_broker_id_local;
    for (auto fed : loopFederates) {
        if (fed->getState() != FederateStates::FINISHED) {
            bye.dest_id = fed->global_id;
            fed->addAction(bye);
        }
        if (hasTimeDependency) {
            timeCoord->removeDependency(fed->global_id);
            timeCoord->removeDependent(fed->global_id);
        }
    }
    if (hasTimeDependency) {
        timeCoord->disconnect();
    }
    if (filterFed != nullptr) {
        filterFed->handleMessage(bye);
    }
    ActionMessage disconnect(CMD_DISCONNECT);
    disconnect.source_id = global_broker_id_local;
    transmit(parent_route_id, disconnect);
}